

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O0

void __thiscall
btSimulationIslandManager::buildAndProcessIslands
          (btSimulationIslandManager *this,btDispatcher *dispatcher,btCollisionWorld *collisionWorld
          ,IslandCallback *callback)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  btCollisionObjectArray *this_00;
  undefined8 uVar6;
  btCollisionObject **ppbVar7;
  btElement *pbVar8;
  btCollisionObject *in_RCX;
  btCollisionWorld *in_RDX;
  long *in_RSI;
  btSimulationIslandManager *in_RDI;
  bool bVar9;
  btCollisionWorld *in_stack_00000040;
  btDispatcher *in_stack_00000048;
  btSimulationIslandManager *in_stack_00000050;
  int curIslandId;
  btPersistentManifold **startManifold;
  int numIslandManifolds;
  btCollisionObject *colObj0;
  int i;
  bool islandSleeping;
  int islandId;
  int endManifoldIndex;
  int startManifoldIndex;
  int numManifolds;
  int maxNumManifolds;
  btPersistentManifold **manifold;
  CProfileSample __profile;
  int numElem;
  int startIslandIndex;
  int endIslandIndex;
  btCollisionObjectArray *collisionObjects;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  btCollisionObject *in_stack_fffffffffffffeb0;
  btPersistentManifoldSortPredicate *in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  btPersistentManifold **in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  btPersistentManifold **local_88;
  uint local_7c;
  int local_60;
  int local_5c;
  int local_30;
  int local_2c;
  
  this_00 = btCollisionWorld::getCollisionObjectArray(in_RDX);
  buildIslands(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  getUnionFind(in_RDI);
  iVar2 = btUnionFind::getNumElements((btUnionFind *)0x1a2529);
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffeb0,
             (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if ((in_RDI->m_splitIslands & 1U) == 0) {
    uVar6 = (**(code **)(*in_RSI + 0x58))();
    uVar3 = (**(code **)(*in_RSI + 0x48))();
    ppbVar7 = btAlignedObjectArray<btCollisionObject_*>::operator[](this_00,0);
    uVar4 = btAlignedObjectArray<btCollisionObject_*>::size(this_00);
    (*in_RCX->_vptr_btCollisionObject[2])(in_RCX,ppbVar7,(ulong)uVar4,uVar6,(ulong)uVar3,0xffffffff)
    ;
  }
  else {
    iVar5 = btAlignedObjectArray<btPersistentManifold_*>::size(&in_RDI->m_islandmanifold);
    btAlignedObjectArray<btPersistentManifold_*>::quickSort<btPersistentManifoldSortPredicate>
              ((btAlignedObjectArray<btPersistentManifold_*> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    local_5c = 0;
    local_60 = 1;
    local_30 = 0;
    while (local_30 < iVar2) {
      getUnionFind(in_RDI);
      pbVar8 = btUnionFind::getElement
                         ((btUnionFind *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      uVar3 = pbVar8->m_id;
      bVar1 = true;
      local_2c = local_30;
      while( true ) {
        bVar9 = false;
        if (local_2c < iVar2) {
          getUnionFind(in_RDI);
          pbVar8 = btUnionFind::getElement
                             ((btUnionFind *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
          bVar9 = pbVar8->m_id == uVar3;
        }
        if (!bVar9) break;
        getUnionFind(in_RDI);
        pbVar8 = btUnionFind::getElement
                           ((btUnionFind *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        btAlignedObjectArray<btCollisionObject_*>::operator[](this_00,pbVar8->m_sz);
        btAlignedObjectArray<btCollisionObject_*>::push_back
                  ((btAlignedObjectArray<btCollisionObject_*> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (btCollisionObject **)in_stack_fffffffffffffeb8);
        bVar9 = btCollisionObject::isActive(in_stack_fffffffffffffeb0);
        if (bVar9) {
          bVar1 = false;
        }
        local_2c = local_2c + 1;
      }
      local_7c = 0;
      local_88 = (btPersistentManifold **)0x0;
      if (local_5c < iVar5) {
        btAlignedObjectArray<btPersistentManifold_*>::operator[](&in_RDI->m_islandmanifold,local_5c)
        ;
        uVar4 = getIslandId((btPersistentManifold *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if (uVar4 == uVar3) {
          local_88 = btAlignedObjectArray<btPersistentManifold_*>::operator[]
                               (&in_RDI->m_islandmanifold,local_5c);
          local_60 = local_5c;
          do {
            local_60 = local_60 + 1;
            bVar9 = false;
            if (local_60 < iVar5) {
              in_stack_fffffffffffffec4 = uVar3;
              in_stack_fffffffffffffec8 =
                   btAlignedObjectArray<btPersistentManifold_*>::operator[]
                             (&in_RDI->m_islandmanifold,local_60);
              in_stack_fffffffffffffec0 =
                   getIslandId((btPersistentManifold *)
                               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
              bVar9 = in_stack_fffffffffffffec4 == in_stack_fffffffffffffec0;
            }
          } while (bVar9);
          local_7c = local_60 - local_5c;
          in_stack_fffffffffffffed7 = 0;
        }
      }
      if (!bVar1) {
        in_stack_fffffffffffffeb0 = in_RCX;
        in_stack_fffffffffffffeb8 =
             (btPersistentManifoldSortPredicate *)
             btAlignedObjectArray<btCollisionObject_*>::operator[](&in_RDI->m_islandBodies,0);
        in_stack_fffffffffffffeac =
             btAlignedObjectArray<btCollisionObject_*>::size(&in_RDI->m_islandBodies);
        (*in_stack_fffffffffffffeb0->_vptr_btCollisionObject[2])
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                   (ulong)in_stack_fffffffffffffeac,local_88,(ulong)local_7c,(ulong)uVar3);
      }
      if (local_7c != 0) {
        local_5c = local_60;
      }
      btAlignedObjectArray<btCollisionObject_*>::resize
                ((btAlignedObjectArray<btCollisionObject_*> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (btCollisionObject **)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                );
      local_30 = local_2c;
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x1a2a77);
  return;
}

Assistant:

void btSimulationIslandManager::buildAndProcessIslands(btDispatcher* dispatcher,btCollisionWorld* collisionWorld, IslandCallback* callback)
{
	btCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher,collisionWorld);

	int endIslandIndex=1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if(!m_splitIslands)
	{
		btPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0],collisionObjects.size(),manifold,maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), btPersistentManifoldSortPredicate);

		int numManifolds = int (m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		m_islandmanifold.quickSort(btPersistentManifoldSortPredicate());
		//m_islandmanifold.heapSort(btPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		

	//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for ( startIslandIndex=0;startIslandIndex<numElem;startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;


			   bool islandSleeping = true;
	                
					for (endIslandIndex = startIslandIndex;(endIslandIndex<numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId);endIslandIndex++)
					{
							int i = getUnionFind().getElement(endIslandIndex).m_sz;
							btCollisionObject* colObj0 = collisionObjects[i];
							m_islandBodies.push_back(colObj0);
							if (colObj0->isActive())
									islandSleeping = false;
					}
	                

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			btPersistentManifold** startManifold = 0;

			if (startManifoldIndex<numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];
				
					for (endManifoldIndex = startManifoldIndex+1;(endManifoldIndex<numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex]));endManifoldIndex++)
					{

					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex-startManifoldIndex;
				}

			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0],m_islandBodies.size(),startManifold,numIslandManifolds, islandId);
	//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}
			
			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	} // else if(!splitIslands) 

}